

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreXmlSerializer.cpp
# Opt level: O2

void __thiscall Assimp::Ogre::OgreXmlSerializer::ReadSubMesh(OgreXmlSerializer *this,MeshXml *mesh)

{
  string *__lhs;
  IndexDataXml *pIVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  uint32_t uVar5;
  SubMeshXml *this_00;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Logger *pLVar6;
  VertexDataXml *this_01;
  undefined4 extraout_var_01;
  DeadlyImportError *pDVar7;
  char *pcVar8;
  string local_1e0;
  SubMeshXmlList *local_1c0;
  MeshXml *local_1b8;
  SubMeshXml *submesh;
  undefined1 local_1a8 [8];
  uint *local_1a0;
  
  this_00 = (SubMeshXml *)operator_new(0xa8);
  SubMeshXml::SubMeshXml(this_00);
  submesh = this_00;
  iVar4 = (*this->m_reader->_vptr_IIrrXMLReader[7])(this->m_reader,"material");
  if (CONCAT44(extraout_var,iVar4) != 0) {
    ReadAttribute<std::__cxx11::string>((string *)local_1a8,this,"material");
    std::__cxx11::string::operator=
              ((string *)&(this_00->super_ISubMesh).materialRef,(string *)local_1a8);
    std::__cxx11::string::~string((string *)local_1a8);
  }
  iVar4 = (*this->m_reader->_vptr_IIrrXMLReader[7])(this->m_reader,"usesharedvertices");
  if (CONCAT44(extraout_var_00,iVar4) != 0) {
    bVar2 = ReadAttribute<bool>(this,"usesharedvertices");
    (this_00->super_ISubMesh).usesSharedVertexData = bVar2;
  }
  pLVar6 = DefaultLogger::get();
  Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
  basic_formatter<char[17]>
            ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
             (char (*) [17])"Reading SubMesh ");
  std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
  std::__cxx11::stringbuf::str();
  Logger::debug(pLVar6,local_1e0._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  pLVar6 = DefaultLogger::get();
  Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
  basic_formatter<char[16]>
            ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
             (char (*) [16])"  - Material: \'");
  std::operator<<((ostream *)local_1a8,(string *)&(this_00->super_ISubMesh).materialRef);
  std::operator<<((ostream *)local_1a8,"\'");
  std::__cxx11::stringbuf::str();
  Logger::debug(pLVar6,local_1e0._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  pLVar6 = DefaultLogger::get();
  Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
  basic_formatter<char[27]>
            ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
             (char (*) [27])"  - Uses shared geometry: ");
  pcVar8 = "false";
  if ((this_00->super_ISubMesh).usesSharedVertexData != false) {
    pcVar8 = "true";
  }
  std::operator<<((ostream *)local_1a8,pcVar8);
  std::__cxx11::stringbuf::str();
  Logger::debug(pLVar6,local_1e0._M_dataplus._M_p);
  local_1c0 = &mesh->subMeshes;
  local_1b8 = mesh;
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  NextNode_abi_cxx11_(this);
  __lhs = &this->m_currentNodeName;
  bVar2 = false;
  while( true ) {
    while( true ) {
      bVar3 = std::operator==(__lhs,"faces");
      if (!bVar3) {
        bVar3 = std::operator==(__lhs,"geometry");
        if (!bVar3) {
          bVar3 = std::operator==(__lhs,"textures");
          if (!bVar3) {
            bVar3 = std::operator==(__lhs,"boneassignments");
            if (!bVar3) {
              (this_00->super_ISubMesh).index =
                   (uint)((ulong)((long)(local_1b8->subMeshes).
                                        super__Vector_base<Assimp::Ogre::SubMeshXml_*,_std::allocator<Assimp::Ogre::SubMeshXml_*>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(local_1b8->subMeshes).
                                       super__Vector_base<Assimp::Ogre::SubMeshXml_*,_std::allocator<Assimp::Ogre::SubMeshXml_*>_>
                                       ._M_impl.super__Vector_impl_data._M_start) >> 3);
              std::vector<Assimp::Ogre::SubMeshXml_*,_std::allocator<Assimp::Ogre::SubMeshXml_*>_>::
              push_back(local_1c0,&submesh);
              return;
            }
          }
        }
      }
      bVar3 = std::operator==(__lhs,"faces");
      if (bVar3) break;
      bVar3 = std::operator==(__lhs,"geometry");
      if (bVar3) {
        if ((this_00->super_ISubMesh).usesSharedVertexData == true) {
          pDVar7 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
          std::__cxx11::string::string
                    ((string *)local_1a8,
                     "Found <geometry> in <submesh> when use shared geometry is true. Invalid mesh file."
                     ,(allocator *)&local_1e0);
          DeadlyImportError::DeadlyImportError(pDVar7,(string *)local_1a8);
          __cxa_throw(pDVar7,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
        }
        this_01 = (VertexDataXml *)operator_new(0xe0);
        VertexDataXml::VertexDataXml(this_01);
        this_00->vertexData = this_01;
        ReadGeometry(this,this_01);
      }
      else {
        bVar3 = std::operator==(__lhs,"boneassignments");
        if (bVar3) {
          ReadBoneAssignments(this,this_00->vertexData);
        }
        else {
          SkipCurrentNode_abi_cxx11_(this);
        }
      }
    }
    uVar5 = ReadAttribute<unsigned_int>(this,"count");
    this_00->indexData->faceCount = uVar5;
    std::vector<aiFace,_std::allocator<aiFace>_>::reserve
              (&this_00->indexData->faces,(ulong)this_00->indexData->faceCount);
    NextNode_abi_cxx11_(this);
    while( true ) {
      bVar3 = std::operator==(__lhs,"face");
      if (!bVar3) break;
      local_1a0 = (uint *)0x0;
      local_1a8._0_4_ = 3;
      local_1a0 = (uint *)operator_new__(0xc);
      uVar5 = ReadAttribute<unsigned_int>(this,"v1");
      *local_1a0 = uVar5;
      uVar5 = ReadAttribute<unsigned_int>(this,"v2");
      local_1a0[1] = uVar5;
      uVar5 = ReadAttribute<unsigned_int>(this,"v3");
      local_1a0[2] = uVar5;
      bVar3 = !bVar2;
      bVar2 = true;
      if (bVar3) {
        iVar4 = (*this->m_reader->_vptr_IIrrXMLReader[7])(this->m_reader,"v4");
        if (CONCAT44(extraout_var_01,iVar4) == 0) {
          bVar2 = false;
        }
        else {
          pLVar6 = DefaultLogger::get();
          Logger::warn(pLVar6,
                       "Submesh <face> has quads with <v4>, only triangles are supported at the moment!"
                      );
        }
      }
      std::vector<aiFace,_std::allocator<aiFace>_>::push_back
                (&this_00->indexData->faces,(value_type *)local_1a8);
      NextNode_abi_cxx11_(this);
      aiFace::~aiFace((aiFace *)local_1a8);
    }
    pIVar1 = this_00->indexData;
    if ((long)(pIVar1->faces).super__Vector_base<aiFace,_std::allocator<aiFace>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(pIVar1->faces).super__Vector_base<aiFace,_std::allocator<aiFace>_>._M_impl.
              super__Vector_impl_data._M_start >> 4 != (ulong)pIVar1->faceCount) break;
    pLVar6 = DefaultLogger::get();
    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
    basic_formatter<char[11]>
              ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
               (char (*) [11])"  - Faces ");
    Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator_
              ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)local_1a8,
               &this_00->indexData->faceCount);
    std::__cxx11::stringbuf::str();
    Logger::debug(pLVar6,local_1e0._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&local_1e0);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  }
  pDVar7 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::operator<<((ostream *)local_1a8,"Read only ");
  std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
  std::operator<<((ostream *)local_1a8," faces when should have read ");
  Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator<<
            ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)local_1a8,
             &this_00->indexData->faceCount);
  std::__cxx11::stringbuf::str();
  DeadlyImportError::DeadlyImportError(pDVar7,&local_1e0);
  __cxa_throw(pDVar7,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void OgreXmlSerializer::ReadSubMesh(MeshXml *mesh)
{
    static const char *anMaterial          = "material";
    static const char *anUseSharedVertices = "usesharedvertices";
    static const char *anCount             = "count";
    static const char *anV1                = "v1";
    static const char *anV2                = "v2";
    static const char *anV3                = "v3";
    static const char *anV4                = "v4";

    SubMeshXml* submesh = new SubMeshXml();

    if (HasAttribute(anMaterial)) {
        submesh->materialRef = ReadAttribute<std::string>(anMaterial);
    }
    if (HasAttribute(anUseSharedVertices)) {
        submesh->usesSharedVertexData = ReadAttribute<bool>(anUseSharedVertices);
    }

    ASSIMP_LOG_DEBUG_F( "Reading SubMesh ", mesh->subMeshes.size());
    ASSIMP_LOG_DEBUG_F( "  - Material: '", submesh->materialRef, "'");
    ASSIMP_LOG_DEBUG_F( "  - Uses shared geometry: ", (submesh->usesSharedVertexData ? "true" : "false"));

    // TODO: maybe we have always just 1 faces and 1 geometry and always in this order. this loop will only work correct, when the order
    // of faces and geometry changed, and not if we have more than one of one
    /// @todo Fix above comment with better read logic below

    bool quadWarned = false;

    NextNode();
    while(m_currentNodeName == nnFaces     ||
          m_currentNodeName == nnGeometry  ||
          m_currentNodeName == nnTextures  ||
          m_currentNodeName == nnBoneAssignments)
    {
        if (m_currentNodeName == nnFaces)
        {
            submesh->indexData->faceCount = ReadAttribute<uint32_t>(anCount);
            submesh->indexData->faces.reserve(submesh->indexData->faceCount);

            NextNode();
            while(m_currentNodeName == nnFace)
            {
                aiFace face;
                face.mNumIndices = 3;
                face.mIndices = new unsigned int[3];
                face.mIndices[0] = ReadAttribute<uint32_t>(anV1);
                face.mIndices[1] = ReadAttribute<uint32_t>(anV2);
                face.mIndices[2] = ReadAttribute<uint32_t>(anV3);

                /// @todo Support quads if Ogre even supports them in XML (I'm not sure but I doubt it)
                if (!quadWarned && HasAttribute(anV4)) {
                    ASSIMP_LOG_WARN("Submesh <face> has quads with <v4>, only triangles are supported at the moment!");
                    quadWarned = true;
                }

                submesh->indexData->faces.push_back(face);

                // Advance
                NextNode();
            }

            if (submesh->indexData->faces.size() == submesh->indexData->faceCount) {
                ASSIMP_LOG_DEBUG_F( "  - Faces ", submesh->indexData->faceCount);
            } else {
                throw DeadlyImportError(Formatter::format() << "Read only " << submesh->indexData->faces.size() << " faces when should have read " << submesh->indexData->faceCount);
            }
        } else if (m_currentNodeName == nnGeometry) {
            if (submesh->usesSharedVertexData) {
                throw DeadlyImportError("Found <geometry> in <submesh> when use shared geometry is true. Invalid mesh file.");
            }

            submesh->vertexData = new VertexDataXml();
            ReadGeometry(submesh->vertexData);
        } else if (m_currentNodeName == nnBoneAssignments) {
            ReadBoneAssignments(submesh->vertexData);
        }
        // Assimp incompatible/ignored nodes
        else {
            SkipCurrentNode();
        }
    }

    submesh->index = static_cast<unsigned int>(mesh->subMeshes.size());
    mesh->subMeshes.push_back(submesh);
}